

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void genDotIntersect(atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,atomBins *bbins,
                    pointSet *dots,float probeRad,float spikelen,int srcFlag,int targFlg,
                    dotNode *(*results) [7])

{
  atom *paVar1;
  bool local_99;
  dotNode *local_98;
  dotNode *prevNode;
  dotNode *curNode;
  dotNode *head;
  atom *target;
  atom *source;
  int j;
  int i;
  int oktargsB;
  int oktargsA;
  int usesMovingAtoms;
  int type;
  atom *atomList2;
  atom *atomList;
  atom *src;
  float local_38;
  int srcFlag_local;
  float spikelen_local;
  float probeRad_local;
  pointSet *dots_local;
  atomBins *bbins_local;
  atom *allMovingAtoms_local;
  atomBins *abins_local;
  atom *allMainAtoms_local;
  
  atomList = (atom *)0x0;
  atomList2 = (atom *)0x0;
  _usesMovingAtoms = (atom *)0x0;
  oktargsA = 0;
  oktargsB = 0;
  i = 1;
  j = 1;
  src._4_4_ = srcFlag;
  local_38 = spikelen;
  srcFlag_local = (int)probeRad;
  _spikelen_local = dots;
  dots_local = (pointSet *)bbins;
  bbins_local = (atomBins *)allMovingAtoms;
  allMovingAtoms_local = (atom *)abins;
  abins_local = (atomBins *)allMainAtoms;
  if (Ldotdump != 0) {
    fprintf(_stderr,"entered genDotIntersect()\n");
  }
  local_99 = bbins_local != (atomBins *)0x0 && dots_local != (pointSet *)0x0;
  oktargsB = (int)local_99;
  for (atomList = (atom *)abins_local; atomList != (atom *)0x0; atomList = atomList->next) {
    if ((atomList->flags & src._4_4_) != 0) {
      i = 1;
      j = 1;
      atomList2 = findTouchingAtoms(atomList,(atom *)0x0,(atomBins *)allMovingAtoms_local,
                                    (float)srcFlag_local,targFlg,&i);
      paVar1 = atomList2;
      if (oktargsB != 0) {
        paVar1 = findTouchingAtoms(atomList,atomList2,(atomBins *)dots_local,(float)srcFlag_local,
                                   targFlg,&j);
      }
      _usesMovingAtoms = paVar1;
      if (Ldotdump != 0) {
        fprintf(_stderr,"findTouchingAtoms() sets oktargsA== %d \n",(ulong)(uint)i);
      }
      if ((_usesMovingAtoms != (atom *)0x0) && ((i != 0 || ((oktargsB != 0 && (j != 0)))))) {
        markBonds(atomList,_usesMovingAtoms,1,Maxbonded);
        if (3 < Maxbonded) {
          fixupLongBondChains(atomList,_usesMovingAtoms,3);
        }
        oktargsA = dotType(atomList,_usesMovingAtoms,0);
        if (LOneDotEach == 0) {
          examineDots(atomList,oktargsA,_usesMovingAtoms,_spikelen_local,(float)srcFlag_local,
                      local_38,targFlg,results);
        }
        else {
          if (Ldotdump != 0) {
            fprintf(_stderr,"genDotIntersect() calls examineOneDotEach()\n");
          }
          examineOneDotEach(atomList,oktargsA,_usesMovingAtoms,_spikelen_local,(float)srcFlag_local,
                            local_38,targFlg,results,(atom *)abins_local);
        }
        if ((Verbose != 0) && (ShowTicks != 0)) {
          fprintf(_stderr,"%s%d   \r",atomList->r->resname,(ulong)(uint)atomList->r->resid);
        }
      }
    }
  }
  if (oktargsB != 0) {
    for (atomList = (atom *)bbins_local; atomList != (atom *)0x0; atomList = atomList->next) {
      if ((atomList->flags & src._4_4_) != 0) {
        i = 1;
        j = 1;
        atomList2 = findTouchingAtoms(atomList,(atom *)0x0,(atomBins *)allMovingAtoms_local,
                                      (float)srcFlag_local,targFlg,&i);
        _usesMovingAtoms =
             findTouchingAtoms(atomList,atomList2,(atomBins *)dots_local,(float)srcFlag_local,
                               targFlg,&j);
        if ((_usesMovingAtoms != (atom *)0x0) && ((i != 0 || (j != 0)))) {
          markBonds(atomList,_usesMovingAtoms,1,Maxbonded);
          if (3 < Maxbonded) {
            fixupLongBondChains(atomList,_usesMovingAtoms,3);
          }
          oktargsA = dotType(atomList,_usesMovingAtoms,0);
          examineDots(atomList,oktargsA,_usesMovingAtoms,_spikelen_local,(float)srcFlag_local,
                      local_38,targFlg,results);
          if ((Verbose != 0) && (ShowTicks != 0)) {
            fprintf(_stderr,"%s%d   \r",atomList->r->resname,(ulong)(uint)atomList->r->resid);
          }
        }
      }
    }
  }
  for (source._4_4_ = 0; source._4_4_ < 0x72; source._4_4_ = source._4_4_ + 1) {
    for (source._0_4_ = 0; (int)source < 6; source._0_4_ = (int)source + 1) {
      curNode = results[source._4_4_][(int)source];
      local_98 = (dotNode *)0x0;
      prevNode = curNode;
      while (prevNode != (dotNode *)0x0) {
        if (((prevNode->a->altConf != ' ') && (prevNode->t->altConf != ' ')) ||
           (1.0 < prevNode->a->occ + prevNode->t->occ)) {
          local_98 = prevNode;
          prevNode = prevNode->next;
        }
        else if (prevNode == curNode) {
          curNode = prevNode->next;
          free(prevNode);
          local_98 = (dotNode *)0x0;
          prevNode = curNode;
        }
        else {
          local_98->next = prevNode->next;
          free(prevNode);
          prevNode = local_98->next;
        }
      }
      results[source._4_4_][(int)source] = curNode;
    }
  }
  return;
}

Assistant:

void genDotIntersect(atom *allMainAtoms, atomBins *abins,
			atom *allMovingAtoms, atomBins *bbins,
			pointSet dots[],
			float probeRad, float spikelen,
			int srcFlag, int targFlg, dotNode *results[][NODEWIDTH])
{/*genDotIntersect()*/

   atom *src = NULL, *atomList = NULL, *atomList2 = NULL;
   int type = 0, usesMovingAtoms = FALSE;
   int oktargsA = TRUE, oktargsB = TRUE;

    int i=0,j=0;/* SJ - 05/06/2015 moved the variables here from below for compatibility with windows C compiler*/ 
    atom *source = NULL, *target=NULL;
    dotNode *head = NULL, *curNode = NULL, *prevNode = NULL;

   if(Ldotdump) {
    fprintf(stderr,"entered genDotIntersect()\n");
   }

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));

   for(src = allMainAtoms; src; src = src->next) /*main==autobondrotstatic*/
   {/*for: loop over all main atoms taking each in turn as the src-atom*/

      if (src->flags & srcFlag)  /*dcr?: seems srcFlag always either 1 or 2 ??*/
      {/*for each src atom*/

          oktargsA = TRUE; oktargsB = TRUE;
          atomList = findTouchingAtoms(src, NULL,abins, probeRad, targFlg, &oktargsA);

           /*20111206 findTouchingAtoms() sets ~exactly overlapping atoms to be NOT oktargsA*/
           /*this is where too close things fail to show dots !! ?? */

          if (usesMovingAtoms) /*autobondrot*/
          {
	            atomList2 = findTouchingAtoms(src, atomList, bbins, probeRad, targFlg, &oktargsB);
	        }
	        else
          {
               atomList2 = atomList;
          }

          if(Ldotdump)
              fprintf(stderr,"findTouchingAtoms() sets oktargsA== %d \n",oktargsA);
          if (atomList2 && (oktargsA || (usesMovingAtoms && oktargsB) ))
          {
	           markBonds(src, atomList2, 1, Maxbonded); /*in genDotIntersect()*/
              /*markBonds identifies bonds between atoms - */
              /*seems not to have lower distance limit*/
              /*but this is where autobondrot fails to spike very close atoms*/

              if (Maxbonded > 3)
                   fixupLongBondChains(src, atomList2, 3);

	           type = dotType(src, atomList2, FALSE);

              if(LOneDotEach)
              {
                   if(Ldotdump)
                     fprintf(stderr,"genDotIntersect() calls examineOneDotEach()\n");
                
                   examineOneDotEach(src,type,atomList2,dots,probeRad,spikelen,targFlg,results,allMainAtoms);
                  /*allMainAtoms20120120*/
              }
              else
              {
                  examineDots(src, type, atomList2, dots, probeRad, spikelen, targFlg, results);
              }
              if(Verbose && ShowTicks)
              {
		            fprintf(stderr, "%s%d   \r",
			          src->r->resname, src->r->resid);
              }
          }
      }/*for each src atom*/
   }/*for: loop over all static atoms taking each in turn as the src-atom*/

   if(usesMovingAtoms)
   {/*if: usesMovingAtoms==autobondrot*/

      for(src = allMovingAtoms; src; src = src->next)
      {/*for: loop over allMovingAtoms taking each in turn as the src-atom*/

	       if (src->flags & srcFlag)  /*dcr?: what is being flagged here??*/
         {

	           oktargsA = TRUE;
              oktargsB = TRUE;
	           atomList  = findTouchingAtoms(src, NULL,     abins, probeRad, targFlg, &oktargsA);
	           atomList2 = findTouchingAtoms(src, atomList, bbins, probeRad, targFlg, &oktargsB);
	           if (atomList2 && (oktargsA || oktargsB))
              {
	               markBonds(src, atomList2, 1, Maxbonded);
               /*markBonds identifies bonds between atoms - */
               /*seems not to have lower distance limit*/
              /*but is where autobondrot fails to spike very close atoms*/

	               if (Maxbonded > 3)
                       fixupLongBondChains(src, atomList2, 3);

                 type = dotType(src, atomList2, FALSE);

                  /*usesMovingAtoms==autobondrot does not use LOneDotEach option 111205*/
                 examineDots(src,type,atomList2,dots,probeRad,spikelen,targFlg,results);

	               if(Verbose && ShowTicks)
                 {
		                 fprintf(stderr, "%s%d   \r",
			              src->r->resname, src->r->resid);
                 }
	          }
	      }
      }/*for: loop over allMovingAtoms taking each in turn as the src-atom*/
   }/*if: usesMovingAtoms==autobondrot*/
    
    // SJ - 10/03/2014 - Code to delete contact dots (except H bonds) between atom pairs when atleast one of them has an altConf " " and the sum of their occpancies is <= 1
    // UNKNOWN BUGS: Not sure what this code will do if the results is genearted using autobondrot
    
    for(i=0;i<NUMATOMTYPES;i++)
    {/*loop over atom types*/
       // for(j=0;j<4;j++) // Old: first j:0-3 correspond to wc, cc, so, bo. Not looping over H-bond dotNode, last one is H bonds
        for(j=0; j< NODEWIDTH - 1; j++) // changed on 04/09/2015 SJ to accomodate for extra list for weak H bonds and worse overlaps
            /* see NODEWIDTH definition in probe.h - SJ*/
        {/*loop over wc, cc, weak H bonds (wh, if LweakHbonds is true), so, bo, and worse overlap (wo, if LworseOverlap is true)*/
            
            head = results[i][j];
            prevNode=NULL;
            curNode=head;
            while(curNode) // if the list is empty, it will not enter this loop
            {
                source = curNode->a;
                target = curNode->t;
                if((source->altConf == ' ' || target->altConf == ' ') && source->occ + target->occ <= 1)
                { //this node has to be deleted
                    if(curNode==head)
                    {
                        head=curNode->next;
                        free(curNode);
                        prevNode=NULL;
                        curNode=head;
                    }
                    else
                    {
                        prevNode->next=curNode->next;
                        free(curNode);
                        curNode=prevNode->next;
                    }
                }
                else
                {//move forward when no deletion
                    prevNode=curNode;
                    curNode=curNode->next;
                }
            }/*while loop*/
            results[i][j]=head;
        }/*loop over wc, cc, weak H bonds (wh, if LweakHbonds is true), so, bo, and worse overlap (wo, if LworseOverlap is true)*/
    }/*for loop over atomtypes*/
    //results now is filtered
    
}